

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

void __thiscall QObject::deleteLater(QObject *this)

{
  long lVar1;
  QObjectPrivate *event;
  QThreadData *pQVar2;
  long in_FS_OFFSET;
  QThreadData *objectThreadData;
  int scopeLevel;
  int loopLevel;
  QObjectPrivate *d;
  QPostEventListLocker eventListLocker;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  QDeferredDeleteEvent *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int priority;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QCoreApplicationPrivate::lockThreadPostEventList
            ((QObject *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  event = d_func((QObject *)0x3ef788);
  if ((*(uint *)&(event->super_QObjectData).field_0x30 >> 7 & 1) == 0) {
    *(uint *)&(event->super_QObjectData).field_0x30 =
         *(uint *)&(event->super_QObjectData).field_0x30 | 0x80;
    priority = 0;
    pQVar2 = QThreadData::current();
    if (pQVar2 == (QThreadData *)&DAT_aaaaaaaaaaaaaaaa) {
      priority = _DAT_aaaaaaaaaaaaab2e;
    }
    QCoreApplicationPrivate::QPostEventListLocker::unlock((QPostEventListLocker *)0x3ef856);
    operator_new(0x18);
    QDeferredDeleteEvent::QDeferredDeleteEvent
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
    QCoreApplication::postEvent
              ((QObject *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (QEvent *)event,priority);
  }
  QCoreApplicationPrivate::QPostEventListLocker::~QPostEventListLocker
            ((QPostEventListLocker *)0x3ef8a2);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QObject::deleteLater()
{
#ifdef QT_DEBUG
    if (qApp == this)
        qWarning("You are deferring the delete of QCoreApplication, this may not work as expected.");
#endif


    // De-bounce QDeferredDeleteEvents. Use the post event list mutex
    // to guard access to deleteLaterCalled, so we don't need a separate
    // mutex in QObjectData.
    auto eventListLocker = QCoreApplicationPrivate::lockThreadPostEventList(this);
    if (!eventListLocker.threadData)
        return;

    // FIXME: The deleteLaterCalled flag is part of a bit field,
    // so we likely have data races here, even with the mutex above,
    // as long as we're not guarding every access to the bit field.

    Q_D(QObject);
    if (d->deleteLaterCalled)
        return;

    d->deleteLaterCalled = true;

    int loopLevel = 0;
    int scopeLevel = 0;

    auto *objectThreadData = eventListLocker.threadData;
    if (objectThreadData == QThreadData::current()) {
        // Remember the current running eventloop for deleteLater
        // calls in the object's own thread.

        // Events sent by non-Qt event handlers (such as glib) may not
        // have the scopeLevel set correctly. The scope level makes sure that
        // code like this:
        //     foo->deleteLater();
        //     qApp->processEvents(); // without passing QEvent::DeferredDelete
        // will not cause "foo" to be deleted before returning to the event loop.

        loopLevel = objectThreadData->loopLevel;
        scopeLevel = objectThreadData->scopeLevel;

        // If the scope level is 0 while loopLevel != 0, we are called from a
        // non-conformant code path, and our best guess is that the scope level
        // should be 1. (Loop level 0 is special: it means that no event loops
        // are running.)
        if (scopeLevel == 0 && loopLevel != 0)
            scopeLevel = 1;
    }

    eventListLocker.unlock();
    QCoreApplication::postEvent(this,
        new QDeferredDeleteEvent(loopLevel, scopeLevel));
}